

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint32_t rebuild_hflags_a32(CPUARMState_conflict *env,int fp_el,ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  anon_struct_4_1_54a39816 v_1;
  anon_struct_4_1_54a39816 v;
  uint32_t flags;
  ARMMMUIdx mmu_idx_local;
  int fp_el_local;
  CPUARMState_conflict *env_local;
  
  v_1 = (anon_struct_4_1_54a39816)rebuild_hflags_aprofile(env);
  _Var1 = arm_el_is_aa64(env,1);
  if (_Var1) {
    v_1 = (anon_struct_4_1_54a39816)deposit32((uint32_t)v_1,0xe,1,1);
  }
  iVar2 = arm_current_el(env);
  if (((iVar2 < 2) && ((env->cp15).hstr_el2 != 0)) &&
     (uVar4 = arm_hcr_el2_eff_aarch64(env), (uVar4 & 0x408000000) != 0x408000000)) {
    v_1 = (anon_struct_4_1_54a39816)deposit32((uint32_t)v_1,0x10,1,1);
  }
  uVar3 = rebuild_hflags_common_32(env,fp_el,mmu_idx,(uint32_t)v_1);
  return uVar3;
}

Assistant:

static uint32_t rebuild_hflags_a32(CPUARMState *env, int fp_el,
                                   ARMMMUIdx mmu_idx)
{
    uint32_t flags = rebuild_hflags_aprofile(env);

    if (arm_el_is_aa64(env, 1)) {
        FIELD_DP32(flags, TBFLAG_A32, VFPEN, 1, flags);
    }

    if (arm_current_el(env) < 2 && env->cp15.hstr_el2 &&
        (arm_hcr_el2_eff(env) & (HCR_E2H | HCR_TGE)) != (HCR_E2H | HCR_TGE)) {
        FIELD_DP32(flags, TBFLAG_A32, HSTR_ACTIVE, 1, flags);
    }

    return rebuild_hflags_common_32(env, fp_el, mmu_idx, flags);
}